

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  CURLcode CVar6;
  uint uVar7;
  timediff_t tVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  curltime cVar13;
  curltime newer;
  curltime older;
  
  if (((conn->data->set).field_0x916 & 0x80) != 0) {
    CVar6 = Curl_doh_is_resolved(conn,dns);
    return CVar6;
  }
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *dns = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar1 != 0) {
    pvVar3 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar3 + 0x48),*(Curl_addrinfo **)((long)pvVar3 + 0x50));
    *(undefined8 *)((long)pvVar3 + 0x50) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *dns = (conn->async).dns;
      return CURLE_OK;
    }
    bVar12 = ((conn->bits).field_0x4 & 0x40) == 0;
    pcVar10 = "proxy";
    if (bVar12) {
      pcVar10 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar10,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return bVar12 + CURLE_COULDNT_RESOLVE_PROXY;
  }
  cVar13 = Curl_now();
  uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar13._0_12_,0);
  newer.tv_usec = SUB124(cVar13._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    uVar7 = 1;
  }
  else {
    uVar11 = *(int *)((long)pvVar3 + 8) << (*(long *)((long)pvVar3 + 0x10) <= lVar9);
    uVar7 = 0xfa;
    if (uVar11 < 0xfa) {
      uVar7 = uVar11;
    }
    if ((lVar9 < *(long *)((long)pvVar3 + 0x10)) && (uVar11 < 0xfb)) goto LAB_00138a5f;
  }
  *(uint *)((long)pvVar3 + 8) = uVar7;
LAB_00138a5f:
  *(ulong *)((long)pvVar3 + 0x10) = lVar9 + (ulong)uVar7;
  Curl_expire(conn->data,(ulong)uVar7,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->data->set.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}